

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-kalman-filter.cpp
# Opt level: O3

double testExtendedKalmanFilterLTV(void)

{
  double **ppdVar1;
  double **ppdVar2;
  double *pdVar3;
  double *pdVar4;
  double *pdVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  double dVar8;
  Scalar SVar9;
  Index IVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  uint uVar13;
  DenseStorage<double,__1,__1,_1,_0> *pDVar14;
  void *pvVar15;
  undefined8 *puVar16;
  Index index;
  Matrix<double,__1,__1,_0,__1,__1> *pMVar17;
  Matrix<double,__1,__1,_0,__1,__1> *pMVar18;
  char *pcVar19;
  long lVar20;
  long lVar21;
  uint i;
  ulong uVar22;
  int iVar23;
  long lVar24;
  undefined1 *puVar25;
  Index size;
  Index size_1;
  undefined4 uVar26;
  undefined4 uVar27;
  Cmatrix c;
  Pmatrix p;
  StateVector xh;
  StateVector x;
  StateVector v;
  StateVector error;
  Qmatrix q1;
  StateVector dx;
  Rmatrix r;
  Rmatrix r1;
  KalmanFunctorLTV func;
  Qmatrix q;
  StateVector xk [1001];
  InputVector uk [1001];
  MeasureVector yk [1000];
  lagged_fibonacci1279 gen_;
  undefined1 local_e548 [8];
  Matrix<double,__1,__1,_0,__1,__1> local_e540;
  double local_e528;
  scalar_sum_op<double,_double> local_e519;
  Matrix<double,__1,__1,_0,__1,__1> local_e518;
  undefined1 local_e500 [24];
  Matrix<double,__1,__1,_0,__1,__1> *local_e4e8;
  Matrix<double,__1,__1,_0,__1,__1> local_e4e0;
  undefined8 local_e4c8;
  Matrix<double,__1,__1,_0,__1,__1> *local_e4b8;
  long lStack_e4b0;
  Matrix<double,__1,__1,_0,__1,__1> local_e4a8;
  void *local_e490 [2];
  Matrix<double,__1,__1,_0,__1,__1> local_e480;
  long local_e468;
  Matrix<double,__1,__1,_0,__1,__1> local_e460;
  undefined1 local_e448 [8];
  vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::aligned_allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  local_e440;
  vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::aligned_allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  vStack_e428;
  double *local_e410;
  Index IStack_e408;
  DenseStorage<double,__1,__1,_1,_0> *local_e400;
  Matrix<double,__1,__1,_0,__1,__1> *pMStack_e3f8;
  void *local_e3f0;
  DenseStorage<double,__1,__1,_1,_0> *apDStack_e3e8 [2];
  DenseStorage<double,__1,__1,_1,_0> local_e3d8;
  ulong local_e3c8;
  undefined8 local_e3c0;
  undefined1 local_a558 [16];
  Matrix<double,__1,__1,_0,__1,__1> *local_a548 [2];
  undefined1 local_a538 [15984];
  double *apdStack_66c8 [2];
  DenseStorage<double,__1,__1,_1,_0> local_66b8;
  ulong local_66a8;
  lagged_fibonacci_01_engine<double,_48,_1279U,_418U> local_2830;
  
  if ((testExtendedKalmanFilterLTV()::f == '\0') &&
     (iVar23 = __cxa_guard_acquire(&testExtendedKalmanFilterLTV()::f), iVar23 != 0)) {
    stateObservation::ExtendedKalmanFilter::ExtendedKalmanFilter
              ((ExtendedKalmanFilter *)testExtendedKalmanFilterLTV()::f,4,3,1,true,true);
    __cxa_atexit(stateObservation::ExtendedKalmanFilter::~ExtendedKalmanFilter,
                 testExtendedKalmanFilterLTV()::f,&__dso_handle);
    __cxa_guard_release(&testExtendedKalmanFilterLTV()::f);
  }
  stateObservation::DynamicalSystemFunctorBase::DynamicalSystemFunctorBase
            ((DynamicalSystemFunctorBase *)local_e448);
  local_e448 = (undefined1  [8])&PTR__KalmanFunctorLTV_00120c20;
  local_e440.
  super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::aligned_allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_e440.
  super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::aligned_allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e440.
  super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::aligned_allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vStack_e428.
  super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::aligned_allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vStack_e428.
  super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::aligned_allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_e428.
  super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::aligned_allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e410 = (double *)0x0;
  IStack_e408 = 0;
  local_e400 = (DenseStorage<double,__1,__1,_1,_0> *)0x0;
  pMStack_e3f8 = (Matrix<double,__1,__1,_0,__1,__1> *)0x0;
  stateObservation::ObserverBase::stateVectorRandom();
  IVar10 = IStack_e408;
  pdVar4 = local_e410;
  local_e410 = local_e3d8.m_data;
  IStack_e408 = local_e3d8.m_rows;
  local_e3d8.m_data = pdVar4;
  local_e3d8.m_rows = IVar10;
  free(pdVar4);
  stateObservation::ObserverBase::measureVectorRandom();
  pMVar18 = pMStack_e3f8;
  pDVar14 = local_e400;
  local_e400 = (DenseStorage<double,__1,__1,_1,_0> *)local_e3d8.m_data;
  pMStack_e3f8 = (Matrix<double,__1,__1,_0,__1,__1> *)local_e3d8.m_rows;
  local_e3d8.m_data = (double *)pDVar14;
  local_e3d8.m_rows = (Index)pMVar18;
  free(pDVar14);
  iVar23 = 0x3e9;
  do {
    stateObservation::KalmanFilterBase::getAmatrixRandom();
    if ((long)(local_66a8 | local_66b8.m_rows) < 0) goto LAB_00108b3d;
    local_e3d8.m_rows = local_66b8.m_rows;
    local_e3c8 = local_66a8;
    local_e3c0 = 0x3fe0000000000000;
    local_e3d8.m_data = (double *)&local_66b8;
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_a548,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
                *)&local_e3d8);
    std::
    vector<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::aligned_allocator<Eigen::Matrix<double,-1,-1,0,-1,-1>>>
    ::emplace_back<Eigen::Matrix<double,_1,_1,0,_1,_1>>
              ((vector<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::aligned_allocator<Eigen::Matrix<double,_1,_1,0,_1,_1>>>
                *)&local_e440,(Matrix<double,__1,__1,_0,__1,__1> *)local_a548);
    free(local_a548[0]);
    free(local_66b8.m_data);
    stateObservation::KalmanFilterBase::getCmatrixRandom();
    std::
    vector<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::aligned_allocator<Eigen::Matrix<double,-1,-1,0,-1,-1>>>
    ::emplace_back<Eigen::Matrix<double,_1,_1,0,_1,_1>>
              ((vector<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::aligned_allocator<Eigen::Matrix<double,_1,_1,0,_1,_1>>>
                *)&vStack_e428,(Matrix<double,__1,__1,_0,__1,__1> *)&local_e3d8);
    free(local_e3d8.m_data);
    iVar23 = iVar23 + -1;
  } while (iVar23 != 0);
  stateObservation::ExtendedKalmanFilter::setFunctor
            ((DynamicalSystemFunctorBase *)testExtendedKalmanFilterLTV()::f);
  memset(&local_e3d8,0,0x3e90);
  memset(&local_66b8,0,16000);
  memset(local_a548,0,0x3e90);
  stateObservation::ObserverBase::stateVectorZero();
  boost::random::lagged_fibonacci_01_engine<double,_48,_1279U,_418U>::seed
            (&local_2830,
             &boost::random::lagged_fibonacci_01_engine<double,48,1279u,418u>::default_seed);
  stateObservation::KalmanFilterBase::getRmatrixRandom();
  if (-1 < (local_e4a8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_cols | local_e4a8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                     m_storage.m_rows)) {
    local_e4e0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
         local_e4a8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
         m_rows;
    local_e4e0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
         local_e4a8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
         m_cols;
    local_e4c8 = 0x3f847ae147ae147b;
    local_e4e0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
         (double *)&local_e4a8;
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_e460,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
                *)&local_e4e0);
    free(local_e4a8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
         m_data);
    stateObservation::KalmanFilterBase::getQmatrixRandom();
    if (-1 < (local_e480.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_cols | local_e480.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                       m_storage.m_rows)) {
      local_e4e0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
           local_e480.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_rows;
      local_e4e0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
           local_e480.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_cols;
      local_e4c8 = 0x3f847ae147ae147b;
      local_e4e0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
           (double *)&local_e480;
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
      PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_e4a8,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
                  *)&local_e4e0);
      free(local_e480.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_data);
      local_e4e0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
           (double *)&local_e460;
      local_e4e0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
           (Index)local_e4e0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_data;
      Eigen::Matrix<double,-1,-1,0,-1,-1>::
      Matrix<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,0>>
                ((Matrix<double,_1,_1,0,_1,_1> *)&local_e480,
                 (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>
                  *)&local_e4e0);
      local_e4e0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
           (double *)&local_e4a8;
      local_e4e0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
           (Index)local_e4e0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_data;
      Eigen::Matrix<double,-1,-1,0,-1,-1>::
      Matrix<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,0>>
                ((Matrix<double,_1,_1,0,_1,_1> *)&local_e3f0,
                 (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>
                  *)&local_e4e0);
      pMVar18 = local_e4e8;
      uVar11 = local_e500._16_8_;
      if ((Matrix<double,__1,__1,_0,__1,__1> *)local_e3d8.m_rows != local_e4e8) {
        if ((long)local_e4e8 < 0) {
LAB_00108b1e:
          __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                        ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,
                        "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, 1>]"
                       );
        }
        free(local_e3d8.m_data);
        if (pMVar18 == (Matrix<double,__1,__1,_0,__1,__1> *)0x0) {
          pDVar14 = (DenseStorage<double,__1,__1,_1,_0> *)0x0;
        }
        else {
          if ((Matrix<double,__1,__1,_0,__1,__1> *)0x1fffffffffffffff < pMVar18) {
LAB_00108134:
            puVar16 = (undefined8 *)__cxa_allocate_exception(8);
            *puVar16 = stateObservation::ExtendedKalmanFilter::getCMatrixFD;
            __cxa_throw(puVar16,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
          }
          pDVar14 = (DenseStorage<double,__1,__1,_1,_0> *)malloc((long)pMVar18 * 8);
          if (pMVar18 != (Matrix<double,__1,__1,_0,__1,__1> *)0x1 && ((ulong)pDVar14 & 0xf) != 0) {
LAB_00108bc0:
            __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                          ,"/usr/include/eigen3/Eigen/src/Core/util/Memory.h",0xb9,
                          "void *Eigen::internal::aligned_malloc(std::size_t)");
          }
          if (pDVar14 == (DenseStorage<double,__1,__1,_1,_0> *)0x0) goto LAB_00108134;
        }
        local_e3d8.m_rows = (Index)pMVar18;
        local_e3d8.m_data = (double *)pDVar14;
      }
      pMVar17 = (Matrix<double,__1,__1,_0,__1,__1> *)
                ((long)pMVar18 - ((long)pMVar18 >> 0x3f) & 0xfffffffffffffffe);
      if (1 < (long)pMVar18) {
        lVar20 = 0;
        do {
          puVar16 = (undefined8 *)(uVar11 + lVar20 * 8);
          IVar10 = puVar16[1];
          ((double **)local_e3d8.m_data)[lVar20] = (double *)*puVar16;
          ((double **)local_e3d8.m_data + lVar20)[1] = (double *)IVar10;
          lVar20 = lVar20 + 2;
        } while (lVar20 < (long)pMVar17);
      }
      if ((long)pMVar17 < (long)pMVar18) {
        do {
          ((double **)local_e3d8.m_data)[(long)pMVar17] = *(double **)(uVar11 + (long)pMVar17 * 8);
          pMVar17 = (Matrix<double,__1,__1,_0,__1,__1> *)
                    ((long)&(pMVar17->
                            super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                            m_storage.m_data + 1);
        } while (pMVar18 != pMVar17);
      }
      stateObservation::ObserverBase::inputVectorRandom();
      pMVar17 = local_a548[1];
      pMVar18 = local_a548[0];
      local_a548[0] =
           (Matrix<double,__1,__1,_0,__1,__1> *)
           local_e4e0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_data;
      local_a548[1] =
           (Matrix<double,__1,__1,_0,__1,__1> *)
           local_e4e0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_rows;
      local_e4e0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
           (double *)pMVar18;
      local_e4e0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
           (Index)pMVar17;
      free(pMVar18);
      lVar20 = 1;
      do {
        stateObservation::ObserverBase::stateVectorZero();
        for (uVar22 = 0; uVar13 = stateObservation::ObserverBase::getStateSize(), uVar22 < uVar13;
            uVar22 = uVar22 + 1) {
          dVar8 = boost::random::detail::unit_normal_distribution<double>::operator()
                            ((unit_normal_distribution<double> *)&local_e518,&local_2830);
          if (local_e4e0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_rows <= (long)uVar22) goto LAB_00108aa2;
          (&(((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
             local_e4e0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_data)->m_storage).m_data)[uVar22] = (double *)(dVar8 + 0.0);
        }
        if (local_e4a8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_cols != local_e4e0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                      m_storage.m_rows) {
LAB_00108ac1:
          __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                        ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,
                        "Eigen::Product<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, 1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, -1, -1>, Rhs = Eigen::Matrix<double, -1, 1>, Option = 0]"
                       );
        }
        local_e518.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
             = (double *)&local_e4a8;
        local_e518.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
             = (Index)&local_e4e0;
        Eigen::internal::
        call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>,Eigen::internal::assign_op<double,double>>
                  ((Matrix<double,__1,_1,_0,__1,_1> *)&local_e4e0,
                   (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
                    *)&local_e518,(assign_op<double,_double> *)&local_e540,(type)0x0);
        stateObservation::ObserverBase::measureVectorZero();
        for (uVar22 = 0; uVar13 = stateObservation::ObserverBase::getMeasureSize(), uVar22 < uVar13;
            uVar22 = uVar22 + 1) {
          dVar8 = boost::random::detail::unit_normal_distribution<double>::operator()
                            ((unit_normal_distribution<double> *)&local_e540,&local_2830);
          if (local_e518.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_rows <= (long)uVar22) goto LAB_00108aa2;
          (&(((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
             local_e518.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_data)->m_storage).m_data)[uVar22] = (double *)(dVar8 + 0.0);
        }
        if (local_e460.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_cols != local_e518.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                      m_storage.m_rows) goto LAB_00108ac1;
        local_e540.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
             = (double *)&local_e460;
        local_e540.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
             = (Index)&local_e518;
        Eigen::internal::
        call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>,Eigen::internal::assign_op<double,double>>
                  ((Matrix<double,__1,_1,_0,__1,_1> *)&local_e518,
                   (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
                    *)&local_e540,(assign_op<double,_double> *)local_e500,(type)0x0);
        stateObservation::ObserverBase::inputVectorRandom();
        lVar24 = lVar20 * 0x10;
        pMVar18 = local_a548[lVar20 * 2];
        pMVar17 = *(Matrix<double,__1,__1,_0,__1,__1> **)(local_a538 + lVar24 + -8);
        local_a548[lVar20 * 2] =
             (Matrix<double,__1,__1,_0,__1,__1> *)
             local_e540.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_data;
        *(Index *)(local_a538 + lVar24 + -8) =
             local_e540.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_rows;
        local_e540.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
             = (double *)pMVar18;
        local_e540.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
             = (Index)pMVar17;
        free(pMVar18);
        local_e468 = (lVar20 + -1) * 0x10;
        testExtendedKalmanFilterLTV()::KalmanFunctorLTV::stateDynamics(Eigen::
        Matrix<double,-1,1,0,-1,1>const&,Eigen::Matrix<double,_1,1,0,_1,1>_const__unsigned_int_
                  ((Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
                    *)&local_e540,(StateVector *)local_e448,(InputVector *)(local_e500 + 0x10),
                   (int)local_e548 + (int)local_e468 + 0x4000);
        pdVar3 = local_e4e0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_data;
        IVar10 = local_e540.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_rows;
        pdVar4 = local_e540.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_data;
        local_e528 = (double)lVar20;
        if (local_e540.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_rows != local_e4e0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                      m_storage.m_rows) {
LAB_00108ae0:
          pcVar19 = 
          "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::Matrix<double, -1, 1>]"
          ;
          goto LAB_00108af5;
        }
        if (local_e4e8 !=
            (Matrix<double,__1,__1,_0,__1,__1> *)
            local_e540.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_rows) {
          if (local_e540.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_rows < 0) goto LAB_00108b1e;
          free((void *)local_e500._16_8_);
          if ((Matrix<double,__1,__1,_0,__1,__1> *)IVar10 ==
              (Matrix<double,__1,__1,_0,__1,__1> *)0x0) {
            pvVar15 = (void *)0x0;
          }
          else {
            if ((Matrix<double,__1,__1,_0,__1,__1> *)0x1fffffffffffffff < (ulong)IVar10) {
LAB_00108b5c:
              puVar16 = (undefined8 *)__cxa_allocate_exception(8);
              *puVar16 = stateObservation::ExtendedKalmanFilter::getCMatrixFD;
              __cxa_throw(puVar16,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
            }
            pvVar15 = malloc(IVar10 * 8);
            if ((Matrix<double,__1,__1,_0,__1,__1> *)IVar10 !=
                (Matrix<double,__1,__1,_0,__1,__1> *)0x1 && ((ulong)pvVar15 & 0xf) != 0)
            goto LAB_00108bc0;
            if (pvVar15 == (void *)0x0) goto LAB_00108b5c;
          }
          local_e4e8 = (Matrix<double,__1,__1,_0,__1,__1> *)IVar10;
          local_e500._16_8_ = pvVar15;
        }
        pMVar18 = (Matrix<double,__1,__1,_0,__1,__1> *)
                  (IVar10 - (IVar10 >> 0x3f) & 0xfffffffffffffffe);
        if (1 < IVar10) {
          lVar21 = 0;
          do {
            ppdVar1 = &(((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)pdVar4)->
                       m_storage).m_data + lVar21;
            ppdVar2 = &(((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)pdVar3)->
                       m_storage).m_data + lVar21;
            dVar8 = (double)ppdVar1[1] + (double)ppdVar2[1];
            auVar6._8_4_ = SUB84(dVar8,0);
            auVar6._0_8_ = (double)*ppdVar1 + (double)*ppdVar2;
            auVar6._12_4_ = (int)((ulong)dVar8 >> 0x20);
            *(undefined1 (*) [16])(local_e500._16_8_ + lVar21 * 8) = auVar6;
            lVar21 = lVar21 + 2;
          } while (lVar21 < (long)pMVar18);
        }
        if ((long)pMVar18 < IVar10) {
          do {
            *(double *)(local_e500._16_8_ + (long)pMVar18 * 8) =
                 (double)(&(((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)pdVar4)->
                           m_storage).m_data)[(long)pMVar18] +
                 (double)(&(((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)pdVar3)->
                           m_storage).m_data)[(long)pMVar18];
            pMVar18 = (Matrix<double,__1,__1,_0,__1,__1> *)
                      ((long)&(pMVar18->
                              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                              m_storage.m_data + 1);
          } while ((Matrix<double,__1,__1,_0,__1,__1> *)IVar10 != pMVar18);
        }
        free(local_e540.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_data);
        pMVar18 = local_e4e8;
        uVar11 = local_e500._16_8_;
        if ((Matrix<double,__1,__1,_0,__1,__1> *)(&local_e3d8)[lVar20].m_rows != local_e4e8) {
          if ((long)local_e4e8 < 0) goto LAB_00108b1e;
          Eigen::DenseStorage<double,_-1,_-1,_1,_0>::resize
                    (&local_e3d8 + lVar20,(Index)local_e4e8,(Index)local_e4e8,1);
          if ((Matrix<double,__1,__1,_0,__1,__1> *)(&local_e3d8)[lVar20].m_rows != pMVar18) {
            pcVar19 = 
            "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Matrix<double, -1, 1>, T1 = double, T2 = double]"
            ;
            goto LAB_00108bb6;
          }
        }
        pdVar4 = (&local_e3d8)[lVar20].m_data;
        pMVar17 = (Matrix<double,__1,__1,_0,__1,__1> *)
                  ((long)pMVar18 - ((long)pMVar18 >> 0x3f) & 0xfffffffffffffffe);
        if (1 < (long)pMVar18) {
          lVar20 = 0;
          do {
            pdVar3 = (double *)(uVar11 + lVar20 * 8);
            dVar8 = pdVar3[1];
            pdVar5 = pdVar4 + lVar20;
            *pdVar5 = *pdVar3;
            pdVar5[1] = dVar8;
            lVar20 = lVar20 + 2;
          } while (lVar20 < (long)pMVar17);
        }
        if ((long)pMVar17 < (long)pMVar18) {
          do {
            pdVar4[(long)pMVar17] = *(double *)(uVar11 + (long)pMVar17 * 8);
            pMVar17 = (Matrix<double,__1,__1,_0,__1,__1> *)
                      ((long)&(pMVar17->
                              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                              m_storage.m_data + 1);
          } while (pMVar18 != pMVar17);
        }
        testExtendedKalmanFilterLTV()::KalmanFunctorLTV::measureDynamics(Eigen::
        Matrix<double,-1,1,0,-1,1>const&,Eigen::Matrix<double,_1,1,0,_1,1>_const__unsigned_int_
                  (&local_e540,(StateVector *)local_e448,(InputVector *)(local_e500 + 0x10),
                   (int)local_e548 + (int)lVar24 + 0x4000);
        lVar20 = local_e468;
        pdVar3 = local_e518.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_data;
        IVar10 = local_e540.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_rows;
        pdVar4 = local_e540.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_data;
        if (local_e540.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_rows != local_e518.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                      m_storage.m_rows) goto LAB_00108ae0;
        pDVar14 = (DenseStorage<double,__1,__1,_1,_0> *)((long)&local_66b8.m_data + local_e468);
        if (*(Matrix<double,__1,__1,_0,__1,__1> **)((long)&local_66b8.m_rows + local_e468) !=
            (Matrix<double,__1,__1,_0,__1,__1> *)
            local_e540.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_rows) {
          if (local_e540.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_rows < 0) goto LAB_00108b1e;
          Eigen::DenseStorage<double,_-1,_-1,_1,_0>::resize
                    (pDVar14,local_e540.
                             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                             m_storage.m_rows,
                     local_e540.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                     m_storage.m_rows,1);
          if (*(Matrix<double,__1,__1,_0,__1,__1> **)((long)&local_66b8.m_rows + lVar20) !=
              (Matrix<double,__1,__1,_0,__1,__1> *)IVar10) {
            pcVar19 = 
            "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>, T1 = double, T2 = double]"
            ;
LAB_00108bb6:
            __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                          "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,pcVar19);
          }
        }
        pdVar5 = pDVar14->m_data;
        pMVar18 = (Matrix<double,__1,__1,_0,__1,__1> *)
                  (IVar10 - (IVar10 >> 0x3f) & 0xfffffffffffffffe);
        if (1 < IVar10) {
          lVar20 = 0;
          do {
            ppdVar1 = &(((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)pdVar4)->
                       m_storage).m_data + lVar20;
            ppdVar2 = &(((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)pdVar3)->
                       m_storage).m_data + lVar20;
            dVar8 = (double)ppdVar1[1] + (double)ppdVar2[1];
            auVar7._8_4_ = SUB84(dVar8,0);
            auVar7._0_8_ = (double)*ppdVar1 + (double)*ppdVar2;
            auVar7._12_4_ = (int)((ulong)dVar8 >> 0x20);
            *(undefined1 (*) [16])(pdVar5 + lVar20) = auVar7;
            lVar20 = lVar20 + 2;
          } while (lVar20 < (long)pMVar18);
        }
        if ((long)pMVar18 < IVar10) {
          do {
            pdVar5[(long)pMVar18] =
                 (double)(&(((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)pdVar4)->
                           m_storage).m_data)[(long)pMVar18] +
                 (double)(&(((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)pdVar3)->
                           m_storage).m_data)[(long)pMVar18];
            pMVar18 = (Matrix<double,__1,__1,_0,__1,__1> *)
                      ((long)&(pMVar18->
                              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                              m_storage.m_data + 1);
          } while ((Matrix<double,__1,__1,_0,__1,__1> *)IVar10 != pMVar18);
        }
        free(local_e540.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_data);
        free(local_e518.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_data);
        free(local_e4e0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_data);
        lVar20 = (long)local_e528 + 1;
      } while (lVar20 != 0x3e9);
      stateObservation::ObserverBase::stateVectorRandom();
      stateObservation::ZeroDelayObserver::setState
                ((Matrix *)testExtendedKalmanFilterLTV()::f,(uint)local_e500);
      stateObservation::KalmanFilterBase::getPmatrixZero();
      for (uVar22 = 0; uVar13 = stateObservation::ObserverBase::getStateSize(), uVar22 < uVar13;
          uVar22 = uVar22 + 1) {
        if ((long)local_e500._8_8_ <= (long)uVar22) goto LAB_00108aa2;
        if ((local_e518.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_rows <= (long)uVar22) ||
           (local_e518.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_cols <= (long)uVar22)) goto LAB_00108aff;
        (&(((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
           local_e518.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_data)->m_storage).m_data)
        [local_e518.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
         m_rows * uVar22 + uVar22] =
             (&(((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_e500._0_8_)->
               m_storage).m_data)[uVar22];
      }
      local_e540.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
           (double *)&local_e518;
      local_e540.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
           (Index)&local_e518;
      Eigen::Matrix<double,-1,-1,0,-1,-1>::
      Matrix<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,0>>
                ((Matrix<double,_1,_1,0,_1,_1> *)&local_e4e0,
                 (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>
                  *)&local_e540);
      Eigen::internal::
      call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::internal::assign_op<double,double>>
                (&local_e518,&local_e4e0,(assign_op<double,_double> *)local_e490);
      free(local_e4e0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_data);
      stateObservation::KalmanFilterBase::setStateCovariance
                ((Matrix *)testExtendedKalmanFilterLTV()::f);
      stateObservation::KalmanFilterBase::setR((Matrix *)testExtendedKalmanFilterLTV()::f);
      stateObservation::KalmanFilterBase::setQ((Matrix *)testExtendedKalmanFilterLTV()::f);
      stateObservation::ZeroDelayObserver::setInput
                ((Matrix *)testExtendedKalmanFilterLTV()::f,(uint)local_a548);
      for (uVar22 = 0; uVar13 = stateObservation::ObserverBase::getStateSize(), uVar22 < uVar13;
          uVar22 = uVar22 + 1) {
        if ((long)local_e500._8_8_ <= (long)uVar22) {
LAB_00108aa2:
          __assert_fail("index >= 0 && index < size()",
                        "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x19a,
                        "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator[](Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                       );
        }
        if ((local_e518.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_rows <= (long)uVar22) ||
           (local_e518.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_cols <= (long)uVar22)) {
LAB_00108aff:
          __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                        "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f,
                        "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>, Level = 1]"
                       );
        }
        (&(((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
           local_e518.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_data)->m_storage).m_data)
        [local_e518.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
         m_rows * uVar22 + uVar22] =
             (&(((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_e500._0_8_)->
               m_storage).m_data)[uVar22];
      }
      local_e540.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
           (double *)&local_e518;
      local_e540.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
           (Index)&local_e518;
      Eigen::Matrix<double,-1,-1,0,-1,-1>::
      Matrix<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,0>>
                ((Matrix<double,_1,_1,0,_1,_1> *)&local_e4e0,
                 (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>
                  *)&local_e540);
      Eigen::internal::
      call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::internal::assign_op<double,double>>
                (&local_e518,&local_e4e0,(assign_op<double,_double> *)local_e490);
      free(local_e4e0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_data);
      stateObservation::ObserverBase::stateVectorConstant(1.0);
      if (-1 < local_e540.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
               .m_rows) {
        local_e4e0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
             = local_e540.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
               .m_rows;
        local_e4c8 = 0x3e45798ee2308c3a;
        local_e4e0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
             = (double *)&local_e540;
        Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
        PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
                  ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_e490,
                   (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                    *)&local_e4e0);
        free(local_e540.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_data);
        lVar20 = -1000;
        puVar25 = local_a538;
        pDVar14 = &local_66b8;
        do {
          stateObservation::ZeroDelayObserver::setMeasurement
                    ((Matrix *)testExtendedKalmanFilterLTV()::f,(uint)pDVar14);
          stateObservation::ZeroDelayObserver::setInput
                    ((Matrix *)testExtendedKalmanFilterLTV()::f,(uint)puVar25);
          stateObservation::ExtendedKalmanFilter::getAMatrixFD((Matrix *)&local_e4e0);
          stateObservation::ExtendedKalmanFilter::getCMatrixFD((Matrix *)&local_e540);
          stateObservation::KalmanFilterBase::setA((Matrix *)testExtendedKalmanFilterLTV()::f);
          stateObservation::KalmanFilterBase::setC((Matrix *)testExtendedKalmanFilterLTV()::f);
          stateObservation::ZeroDelayObserver::getEstimatedState((uint)&local_e4b8);
          uVar12 = local_e500._8_8_;
          uVar11 = local_e500._0_8_;
          local_e500._0_8_ = local_e4b8;
          local_e500._8_8_ = lStack_e4b0;
          local_e4b8 = (Matrix<double,__1,__1,_0,__1,__1> *)uVar11;
          lStack_e4b0 = uVar12;
          free((void *)uVar11);
          free(local_e540.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
               .m_data);
          free(local_e4e0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
               .m_data);
          puVar25 = puVar25 + 0x10;
          pDVar14 = pDVar14 + 1;
          lVar20 = lVar20 + 1;
        } while (lVar20 != 0);
        local_e4e0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
             = (Index)local_a558;
        local_e4e0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
             = (double *)local_e500;
        if (local_e500._8_8_ == local_a558._8_8_) {
          Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
          PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                    ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_e4b8,
                     (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      *)&local_e4e0);
          local_e540.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_data = (double *)&local_e4b8;
          if (lStack_e4b0 == 0) {
            uVar26 = 0;
            uVar27 = 0;
          }
          else {
            if (lStack_e4b0 < 1) {
              __assert_fail("this->rows()>0 && this->cols()>0 && \"you are using an empty matrix\"",
                            "/usr/include/eigen3/Eigen/src/Core/Redux.h",0x19b,
                            "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>, const Eigen::Matrix<double, -1, 1>>>::redux(const Func &) const [Derived = Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>, const Eigen::Matrix<double, -1, 1>>, BinaryOp = Eigen::internal::scalar_sum_op<double>]"
                           );
            }
            local_e4e0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_rows = (Index)local_e4b8;
            SVar9 = Eigen::internal::
                    redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>>,3,0>
                    ::
                    run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                              ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                *)&local_e4e0,&local_e519,
                               (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                *)&local_e540);
            uVar26 = SUB84(SVar9,0);
            uVar27 = (undefined4)((ulong)SVar9 >> 0x20);
          }
          local_e528 = (double)CONCAT44(uVar27,uVar26);
          free(local_e4b8);
          free(local_e490[0]);
          free(local_e518.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
               .m_data);
          free((void *)local_e500._0_8_);
          free(local_e3f0);
          free(local_e480.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
               .m_data);
          free(local_e4a8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
               .m_data);
          free(local_e460.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
               .m_data);
          free((void *)local_e500._16_8_);
          lVar20 = 0x3e90;
          do {
            free(*(void **)(local_a558 + lVar20));
            lVar20 = lVar20 + -0x10;
          } while (lVar20 != 0);
          lVar20 = 16000;
          do {
            free(*(void **)((long)apdStack_66c8 + lVar20));
            lVar20 = lVar20 + -0x10;
          } while (lVar20 != 0);
          lVar20 = 0x3e90;
          do {
            free(*(void **)((long)apDStack_e3e8 + lVar20));
            lVar20 = lVar20 + -0x10;
          } while (lVar20 != 0);
          local_e528 = SQRT(local_e528);
          local_e448 = (undefined1  [8])&PTR__KalmanFunctorLTV_00120c20;
          free(local_e400);
          free(local_e410);
          std::
          vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
          ::~vector(&vStack_e428);
          std::
          vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
          ::~vector(&local_e440);
          stateObservation::DynamicalSystemFunctorBase::~DynamicalSystemFunctorBase
                    ((DynamicalSystemFunctorBase *)local_e448);
          return local_e528;
        }
        pcVar19 = 
        "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::Matrix<double, -1, 1>]"
        ;
LAB_00108af5:
        __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                      "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,pcVar19);
      }
      pcVar19 = 
      "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, -1, 1>]"
      ;
      goto LAB_00108b52;
    }
  }
LAB_00108b3d:
  pcVar19 = 
  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, -1, -1>]"
  ;
LAB_00108b52:
  __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,pcVar19);
}

Assistant:

double testExtendedKalmanFilterLTV()
{
    const static unsigned kmax=1000;

    typedef stateObservation::ExtendedKalmanFilter ekf;

    static ekf f(4,3,1);


    struct KalmanFunctorLTV:
                public stateObservation::DynamicalSystemFunctorBase
    {

public:
        KalmanFunctorLTV()
        {
            s_=f.stateVectorRandom();
            n_=f.measureVectorRandom();

            for (unsigned i=0;i<=kmax;++i)
            {
                a.push_back( f.getAmatrixRandom()*0.5 );
                c.push_back( f.getCmatrixRandom() );
            }

        }

        virtual ekf::StateVector stateDynamics(const ekf::StateVector& x, const ekf::InputVector& u, unsigned k)
        {
            ekf::StateVector xk1;
            unsigned kk=std::min(k,kmax);
            xk1=a[kk]*x+(u.transpose()*u)(0,0)*s_;

            return xk1;
        }

        virtual ekf::MeasureVector measureDynamics(const ekf::StateVector& x, const ekf::InputVector &u,unsigned k)
        {
            (void)k;//unused
            (void)u;//unused

            ekf::MeasureVector yk;
            unsigned kk=std::min(k,kmax);
            yk=c[kk]*x+(u.transpose()*u)(0,0)*n_;
            return yk;
        }

        virtual unsigned getStateSize() const
        {
            return f.getStateSize();
        }

        virtual unsigned getInputSize() const
        {
            return f.getInputSize();
        }

        virtual unsigned getMeasurementSize() const
        {
            return f.getMeasureSize();
        }

        std::vector<ekf::Amatrix, Eigen::aligned_allocator<ekf::Amatrix> > a;
        std::vector<ekf::Cmatrix, Eigen::aligned_allocator<ekf::Cmatrix> > c;
private:
        ekf::StateVector s_;
        ekf::MeasureVector n_;
    };


    KalmanFunctorLTV func;

    f.setFunctor(&func);



    ekf::StateVector xk[kmax+1];
    ekf::MeasureVector yk[kmax];
    ekf::InputVector uk[kmax+1];

    ekf::StateVector x=f.stateVectorZero();



    boost::lagged_fibonacci1279 gen_;

    ekf::Rmatrix r1=f.getRmatrixRandom()*0.01;

    ekf::Qmatrix q1=f.getQmatrixRandom()*0.01;

    ekf::Rmatrix r(r1*r1.transpose());
    ekf::Qmatrix q(q1*q1.transpose());

    xk[0]=x;
    uk[0]=f.inputVectorRandom();

    for (unsigned k=1; k<=kmax; ++k)
    {
        ekf::StateVector v(f.stateVectorZero());
        for (unsigned i=0;i<f.getStateSize();++i)
        {
            boost::normal_distribution<> g(0, 1);
            v[i]=g(gen_);
        }
        v=q1*v;

        ekf::MeasureVector w(f.measureVectorZero());
        for (unsigned i=0;i<f.getMeasureSize();++i)
        {
            boost::normal_distribution<> g(0, 1);
            w[i]=g(gen_);
        }
        w=r1*w;

        uk[k]=f.inputVectorRandom();

        x=func.stateDynamics(x,uk[k-1],k-1)+v;

        xk[k]=x;
        yk[k-1]=func.measureDynamics(x,uk[k],k)+w;

    }

    ekf::StateVector xh=f.stateVectorRandom();

    f.setState(xh,0);

    ekf::Pmatrix p=f.getPmatrixZero();

    for (unsigned i=0;i<f.getStateSize();++i)
    {
        p(i,i)=xh[i];
    }
    p=p*p.transpose();


    f.setStateCovariance(p);

    f.setR(r);
    f.setQ(q);

    f.setInput(uk[0],0);

    for (unsigned i=0;i<f.getStateSize();++i)
    {
        p(i,i)=xh[i];
    }
    p=p*p.transpose();

    ekf::StateVector dx=f.stateVectorConstant(1)*1e-8;

    unsigned i;
    for (i=1;i<=kmax;++i)
    {
        f.setMeasurement(yk[i-1],i);
        f.setInput(uk[i],i);


        ekf::Amatrix a=f.getAMatrixFD(dx);
        ekf::Cmatrix c= f.getCMatrixFD(dx);

        f.setA(a);
        f.setC(c);

        xh=f.getEstimatedState(i);
    }

    ekf::StateVector error=xh-xk[kmax];

    return error.norm();

}